

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenType.cpp
# Opt level: O0

void __thiscall tokenType::tokenType(tokenType *this,string *name,tokenCategory type)

{
  tokenCategory type_local;
  string *name_local;
  tokenType *this_local;
  
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::operator=((string *)&this->name,(string *)name);
  this->type = type;
  return;
}

Assistant:

tokenType::tokenType(string name, enum tokenCategory type) {
    this->name = name;
    this->type = type;
}